

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockReturnValueTest_ConstPointerReturnValue_TestShell::createTest
          (TEST_MockReturnValueTest_ConstPointerReturnValue_TestShell *this)

{
  Utest *this_00;
  TEST_MockReturnValueTest_ConstPointerReturnValue_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x2ce);
  TEST_MockReturnValueTest_ConstPointerReturnValue_Test::
  TEST_MockReturnValueTest_ConstPointerReturnValue_Test
            ((TEST_MockReturnValueTest_ConstPointerReturnValue_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, ConstPointerReturnValue)
{
    const void* ptr = (const void*) 0x001074;
    mock().expectOneCall("foo").andReturnValue(ptr);
    MockActualCall& actual_call = mock().actualCall("foo");
    POINTERS_EQUAL(ptr, actual_call.returnValue().getConstPointerValue());
    POINTERS_EQUAL(ptr, actual_call.returnConstPointerValue());
    POINTERS_EQUAL(ptr, mock().constPointerReturnValue());
}